

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bindings.cpp
# Opt level: O2

void __thiscall
service::service(service *this,shared_ptr<interface1> *sp,bool b,int i,function<int_()> *f,int ni)

{
  element_type *peVar1;
  long lVar2;
  uint __line;
  int iVar3;
  char *__assertion;
  
  std::__shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2> *)this,
             &sp->super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>);
  peVar1 = (sp->super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    lVar2 = __dynamic_cast(peVar1,&interface1::typeinfo,&implementation1_2::typeinfo,0);
    if (lVar2 != 0) {
      if (b) {
        __assertion = "!b";
        __line = 0x24;
      }
      else if (i == 0x2a) {
        iVar3 = std::function<int_()>::operator()(f);
        if (iVar3 == 0x57) {
          if (ni == 0x7b) {
            return;
          }
          __assertion = "ni == 123";
          __line = 0x27;
        }
        else {
          __assertion = "f() == 87";
          __line = 0x26;
        }
      }
      else {
        __assertion = "i == 42";
        __line = 0x25;
      }
      goto LAB_00103050;
    }
  }
  __assertion = "dynamic_cast<implementation1_2*>(sp.get())";
  __line = 0x23;
LAB_00103050:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                ,__line,
                "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
               );
}

Assistant:

int ni)
      : sp(sp) {
    assert(dynamic_cast<implementation1_2*>(sp.get()));  // overridden
    assert(!b);                                          // default initialization
    assert(i == 42);
    assert(f() == 87);
    assert(ni == 123);
  }